

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_client_hello_get_extension
               (SSL_CLIENT_HELLO *client_hello,CBS *out,uint16_t extension_type)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_50 [8];
  CBS extension;
  undefined1 local_38 [6];
  uint16_t type;
  CBS extensions;
  uint16_t extension_type_local;
  CBS *out_local;
  SSL_CLIENT_HELLO *client_hello_local;
  
  extensions.len._6_2_ = extension_type;
  CBS_init((CBS *)local_38,client_hello->extensions,client_hello->extensions_len);
  while( true ) {
    sVar2 = CBS_len((CBS *)local_38);
    if (sVar2 == 0) {
      return false;
    }
    iVar1 = CBS_get_u16((CBS *)local_38,(uint16_t *)((long)&extension.len + 6));
    if ((iVar1 == 0) ||
       (iVar1 = CBS_get_u16_length_prefixed((CBS *)local_38,(CBS *)local_50), iVar1 == 0)) break;
    if (extension.len._6_2_ == extensions.len._6_2_) {
      out->data = (uint8_t *)local_50;
      out->len = (size_t)extension.data;
      return true;
    }
  }
  return false;
}

Assistant:

bool ssl_client_hello_get_extension(const SSL_CLIENT_HELLO *client_hello,
                                    CBS *out, uint16_t extension_type) {
  CBS extensions;
  CBS_init(&extensions, client_hello->extensions, client_hello->extensions_len);
  while (CBS_len(&extensions) != 0) {
    // Decode the next extension.
    uint16_t type;
    CBS extension;
    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &extension)) {
      return false;
    }

    if (type == extension_type) {
      *out = extension;
      return true;
    }
  }

  return false;
}